

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link_varyings.cpp
# Opt level: O0

void cross_validate_outputs_to_inputs
               (gl_context *ctx,gl_shader_program *prog,gl_linked_shader *producer,
               gl_linked_shader *consumer)

{
  exec_node *peVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  ir_variable *piVar5;
  ir_variable *piVar6;
  ir_variable *piVar7;
  glsl_type *pgVar8;
  char *pcVar9;
  ir_variable *local_19f8;
  ir_variable *local_19f0;
  ir_variable *local_1930;
  ir_variable *local_1928;
  ir_instruction *local_1910;
  ir_instruction *local_1908;
  ir_instruction *local_18e8;
  ir_instruction *local_18e0;
  uint local_18b8;
  uint slot_limit;
  uint idx;
  uint num_elements;
  glsl_type *type;
  ir_variable *output;
  ir_variable *back_color_1;
  ir_variable *front_color_1;
  ir_variable *back_color;
  ir_variable *front_color;
  ir_variable *input;
  ir_instruction *node_1;
  ir_variable *var;
  ir_instruction *local_1850;
  ir_instruction *node;
  explicit_location_info input_explicit_locations [32] [4];
  explicit_location_info output_explicit_locations [32] [4];
  glsl_symbol_table parameters;
  gl_linked_shader *consumer_local;
  gl_linked_shader *producer_local;
  gl_shader_program *prog_local;
  gl_context *ctx_local;
  
  glsl_symbol_table::glsl_symbol_table
            ((glsl_symbol_table *)&output_explicit_locations[0x1f][3].interpolation);
  memset(&input_explicit_locations[0x1f][3].interpolation,0,0xc00);
  memset(&node,0,0xc00);
  bVar2 = exec_node_is_tail_sentinel((producer->ir->head_sentinel).next);
  if (bVar2) {
    local_18e8 = (ir_instruction *)0x0;
  }
  else {
    peVar1 = (producer->ir->head_sentinel).next;
    if (peVar1 == (exec_node *)0x0) {
      local_18e0 = (ir_instruction *)0x0;
    }
    else {
      local_18e0 = (ir_instruction *)&peVar1[-1].prev;
    }
    local_18e8 = local_18e0;
  }
  local_1850 = local_18e8;
  while (local_1850 != (ir_instruction *)0x0) {
    piVar5 = ir_instruction::as_variable(local_1850);
    if ((piVar5 != (ir_variable *)0x0) && ((*(uint *)&piVar5->data >> 0xc & 0xf) == 5)) {
      if (((*(uint *)&piVar5->data >> 0x12 & 1) == 0) || ((piVar5->data).location < 0x20)) {
        glsl_symbol_table::add_variable
                  ((glsl_symbol_table *)&output_explicit_locations[0x1f][3].interpolation,piVar5);
      }
      else {
        bVar2 = validate_explicit_variable_location
                          (ctx,(explicit_location_info (*) [4])
                               &input_explicit_locations[0x1f][3].interpolation,piVar5,prog,producer
                          );
        if (!bVar2) goto LAB_0026afce;
      }
    }
    bVar2 = exec_node_is_tail_sentinel((local_1850->super_exec_node).next);
    if (bVar2) {
      local_1910 = (ir_instruction *)0x0;
    }
    else {
      peVar1 = (local_1850->super_exec_node).next;
      if (peVar1 == (exec_node *)0x0) {
        local_1908 = (ir_instruction *)0x0;
      }
      else {
        local_1908 = (ir_instruction *)&peVar1[-1].prev;
      }
      local_1910 = local_1908;
    }
    local_1850 = local_1910;
  }
  bVar2 = exec_node_is_tail_sentinel((consumer->ir->head_sentinel).next);
  if (bVar2) {
    local_1930 = (ir_variable *)0x0;
  }
  else {
    peVar1 = (consumer->ir->head_sentinel).next;
    if (peVar1 == (exec_node *)0x0) {
      local_1928 = (ir_variable *)0x0;
    }
    else {
      local_1928 = (ir_variable *)&peVar1[-1].prev;
    }
    local_1930 = local_1928;
  }
  input = local_1930;
  while (input != (ir_variable *)0x0) {
    piVar5 = ir_instruction::as_variable(&input->super_ir_instruction);
    if ((piVar5 != (ir_variable *)0x0) && ((*(uint *)&piVar5->data >> 0xc & 0xf) == 4)) {
      iVar3 = strcmp(piVar5->name,"gl_Color");
      if ((iVar3 == 0) && ((*(uint *)&piVar5->data >> 7 & 1) != 0)) {
        piVar6 = glsl_symbol_table::get_variable
                           ((glsl_symbol_table *)&output_explicit_locations[0x1f][3].interpolation,
                            "gl_FrontColor");
        piVar7 = glsl_symbol_table::get_variable
                           ((glsl_symbol_table *)&output_explicit_locations[0x1f][3].interpolation,
                            "gl_BackColor");
        cross_validate_front_and_back_color
                  (ctx,prog,piVar5,piVar6,piVar7,consumer->Stage,producer->Stage);
      }
      else {
        iVar3 = strcmp(piVar5->name,"gl_SecondaryColor");
        if ((iVar3 == 0) && ((*(uint *)&piVar5->data >> 7 & 1) != 0)) {
          piVar6 = glsl_symbol_table::get_variable
                             ((glsl_symbol_table *)&output_explicit_locations[0x1f][3].interpolation
                              ,"gl_FrontSecondaryColor");
          piVar7 = glsl_symbol_table::get_variable
                             ((glsl_symbol_table *)&output_explicit_locations[0x1f][3].interpolation
                              ,"gl_BackSecondaryColor");
          cross_validate_front_and_back_color
                    (ctx,prog,piVar5,piVar6,piVar7,consumer->Stage,producer->Stage);
        }
        else {
          type = (glsl_type *)0x0;
          if (((*(uint *)&piVar5->data >> 0x12 & 1) == 0) || ((piVar5->data).location < 0x20)) {
            type = (glsl_type *)
                   glsl_symbol_table::get_variable
                             ((glsl_symbol_table *)&output_explicit_locations[0x1f][3].interpolation
                              ,piVar5->name);
          }
          else {
            pgVar8 = get_varying_type(piVar5,consumer->Stage);
            uVar4 = glsl_type::count_attribute_slots(pgVar8,false);
            local_18b8 = compute_variable_location_slot(piVar5,consumer->Stage);
            uVar4 = local_18b8 + uVar4;
            bVar2 = validate_explicit_variable_location
                              (ctx,(explicit_location_info (*) [4])&node,piVar5,prog,consumer);
            if (!bVar2) break;
            for (; local_18b8 < uVar4; local_18b8 = local_18b8 + 1) {
              if (0x1f < local_18b8) {
                pcVar9 = _mesa_shader_stage_to_string(consumer->Stage);
                linker_error(prog,"Invalid location %u in %s shader\n",(ulong)local_18b8,pcVar9);
                goto LAB_0026afce;
              }
              type = *(glsl_type **)
                      &input_explicit_locations[(ulong)local_18b8 + 0x1f]
                       [(ulong)(*(uint *)&piVar5->data >> 0x1d & 3) + 3].interpolation;
              if (type == (glsl_type *)0x0) {
                if ((*(uint *)&piVar5->data >> 7 & 1) != 0) {
                  pcVar9 = _mesa_shader_stage_to_string(consumer->Stage);
                  linker_error(prog,
                               "%s shader input `%s\' with explicit location has no matching output\n"
                               ,pcVar9,piVar5->name);
                  break;
                }
              }
              else if ((piVar5->data).location != *(int *)&type[1].fields) {
                pcVar9 = _mesa_shader_stage_to_string(consumer->Stage);
                linker_error(prog,
                             "%s shader input `%s\' with explicit location has no matching output\n"
                             ,pcVar9,piVar5->name);
                break;
              }
            }
          }
          if (type == (glsl_type *)0x0) {
            if ((*(uint *)&piVar5->data >> 8 & 1) != 0) {
              __assert_fail("!input->data.assigned",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/link_varyings.cpp"
                            ,0x36f,
                            "void cross_validate_outputs_to_inputs(struct gl_context *, struct gl_shader_program *, gl_linked_shader *, gl_linked_shader *)"
                           );
            }
            if ((((*(uint *)&piVar5->data >> 7 & 1) != 0) &&
                (pgVar8 = ir_variable::get_interface_type(piVar5), pgVar8 == (glsl_type *)0x0)) &&
               ((*(uint *)&piVar5->data >> 0x12 & 1) == 0)) {
              pcVar9 = _mesa_shader_stage_to_string(consumer->Stage);
              linker_error(prog,
                           "%s shader input `%s\' has no matching output in the previous stage\n",
                           pcVar9,piVar5->name);
            }
          }
          else {
            pgVar8 = ir_variable::get_interface_type(piVar5);
            if ((pgVar8 == (glsl_type *)0x0) ||
               (pgVar8 = ir_variable::get_interface_type((ir_variable *)type),
               pgVar8 == (glsl_type *)0x0)) {
              cross_validate_types_and_qualifiers
                        (ctx,prog,piVar5,(ir_variable *)type,consumer->Stage,producer->Stage);
            }
          }
        }
      }
    }
    bVar2 = exec_node_is_tail_sentinel((input->super_ir_instruction).super_exec_node.next);
    if (bVar2) {
      local_19f8 = (ir_variable *)0x0;
    }
    else {
      peVar1 = (input->super_ir_instruction).super_exec_node.next;
      if (peVar1 == (exec_node *)0x0) {
        local_19f0 = (ir_variable *)0x0;
      }
      else {
        local_19f0 = (ir_variable *)&peVar1[-1].prev;
      }
      local_19f8 = local_19f0;
    }
    input = local_19f8;
  }
LAB_0026afce:
  glsl_symbol_table::~glsl_symbol_table
            ((glsl_symbol_table *)&output_explicit_locations[0x1f][3].interpolation);
  return;
}

Assistant:

void
cross_validate_outputs_to_inputs(struct gl_context *ctx,
                                 struct gl_shader_program *prog,
                                 gl_linked_shader *producer,
                                 gl_linked_shader *consumer)
{
   glsl_symbol_table parameters;
   struct explicit_location_info output_explicit_locations[MAX_VARYING][4] = {};
   struct explicit_location_info input_explicit_locations[MAX_VARYING][4] = {};

   /* Find all shader outputs in the "producer" stage.
    */
   foreach_in_list(ir_instruction, node, producer->ir) {
      ir_variable *const var = node->as_variable();

      if (var == NULL || var->data.mode != ir_var_shader_out)
         continue;

      if (!var->data.explicit_location
          || var->data.location < VARYING_SLOT_VAR0)
         parameters.add_variable(var);
      else {
         /* User-defined varyings with explicit locations are handled
          * differently because they do not need to have matching names.
          */
         if (!validate_explicit_variable_location(ctx,
                                                  output_explicit_locations,
                                                  var, prog, producer)) {
            return;
         }
      }
   }


   /* Find all shader inputs in the "consumer" stage.  Any variables that have
    * matching outputs already in the symbol table must have the same type and
    * qualifiers.
    *
    * Exception: if the consumer is the geometry shader, then the inputs
    * should be arrays and the type of the array element should match the type
    * of the corresponding producer output.
    */
   foreach_in_list(ir_instruction, node, consumer->ir) {
      ir_variable *const input = node->as_variable();

      if (input == NULL || input->data.mode != ir_var_shader_in)
         continue;

      if (strcmp(input->name, "gl_Color") == 0 && input->data.used) {
         const ir_variable *const front_color =
            parameters.get_variable("gl_FrontColor");

         const ir_variable *const back_color =
            parameters.get_variable("gl_BackColor");

         cross_validate_front_and_back_color(ctx, prog, input,
                                             front_color, back_color,
                                             consumer->Stage, producer->Stage);
      } else if (strcmp(input->name, "gl_SecondaryColor") == 0 && input->data.used) {
         const ir_variable *const front_color =
            parameters.get_variable("gl_FrontSecondaryColor");

         const ir_variable *const back_color =
            parameters.get_variable("gl_BackSecondaryColor");

         cross_validate_front_and_back_color(ctx, prog, input,
                                             front_color, back_color,
                                             consumer->Stage, producer->Stage);
      } else {
         /* The rules for connecting inputs and outputs change in the presence
          * of explicit locations.  In this case, we no longer care about the
          * names of the variables.  Instead, we care only about the
          * explicitly assigned location.
          */
         ir_variable *output = NULL;
         if (input->data.explicit_location
             && input->data.location >= VARYING_SLOT_VAR0) {

            const glsl_type *type = get_varying_type(input, consumer->Stage);
            unsigned num_elements = type->count_attribute_slots(false);
            unsigned idx =
               compute_variable_location_slot(input, consumer->Stage);
            unsigned slot_limit = idx + num_elements;

            if (!validate_explicit_variable_location(ctx,
                                                     input_explicit_locations,
                                                     input, prog, consumer)) {
               return;
            }

            while (idx < slot_limit) {
               if (idx >= MAX_VARYING) {
                  linker_error(prog,
                               "Invalid location %u in %s shader\n", idx,
                               _mesa_shader_stage_to_string(consumer->Stage));
                  return;
               }

               output = output_explicit_locations[idx][input->data.location_frac].var;

               if (output == NULL) {
                  /* A linker failure should only happen when there is no
                   * output declaration and there is Static Use of the
                   * declared input.
                   */
                  if (input->data.used) {
                     linker_error(prog,
                                  "%s shader input `%s' with explicit location "
                                  "has no matching output\n",
                                  _mesa_shader_stage_to_string(consumer->Stage),
                                  input->name);
                     break;
                  }
               } else if (input->data.location != output->data.location) {
                  linker_error(prog,
                               "%s shader input `%s' with explicit location "
                               "has no matching output\n",
                               _mesa_shader_stage_to_string(consumer->Stage),
                               input->name);
                  break;
               }
               idx++;
            }
         } else {
            output = parameters.get_variable(input->name);
         }

         if (output != NULL) {
            /* Interface blocks have their own validation elsewhere so don't
             * try validating them here.
             */
            if (!(input->get_interface_type() &&
                  output->get_interface_type()))
               cross_validate_types_and_qualifiers(ctx, prog, input, output,
                                                   consumer->Stage,
                                                   producer->Stage);
         } else {
            /* Check for input vars with unmatched output vars in prev stage
             * taking into account that interface blocks could have a matching
             * output but with different name, so we ignore them.
             */
            assert(!input->data.assigned);
            if (input->data.used && !input->get_interface_type() &&
                !input->data.explicit_location)
               linker_error(prog,
                            "%s shader input `%s' "
                            "has no matching output in the previous stage\n",
                            _mesa_shader_stage_to_string(consumer->Stage),
                            input->name);
         }
      }
   }
}